

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

undefined8
Catch::Detail::StringMakerBase<true>::convert<bsim::static_quad_value_bit_vector<41>>
          (static_quad_value_bit_vector<41> *_value)

{
  undefined8 in_RDI;
  ostringstream oss;
  ostringstream local_188 [16];
  static_quad_value_bit_vector<41> *in_stack_fffffffffffffe88;
  ostream *in_stack_fffffffffffffe90;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  bsim::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }